

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid_lib.cc
# Opt level: O0

void GetGrid(size_t grid_idx,void *index,void *table,char *grid)

{
  long in_RDX;
  long in_RSI;
  ulong in_RDI;
  size_t guesses;
  char pattern [82];
  uint16_t pattern_count;
  size_t to_skip;
  uint16_t indexed_grid_offset;
  uint32_t current_pattern_idx;
  size_t indexed_grid_idx;
  char *in_stack_ffffffffffffff58;
  uint32_t in_stack_ffffffffffffff64;
  size_t in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  undefined2 local_3a;
  undefined8 local_38;
  undefined4 local_2c;
  
  local_2c = *(uint *)(in_RSI + (in_RDI >> 0x14) * 6);
  local_38 = (ulong)*(ushort *)(in_RSI + 4 + (in_RDI >> 0x14) * 6) +
             (in_RDI - (in_RDI & 0xfffffffffff00000));
  local_3a = *(ushort *)(in_RDX + (ulong)local_2c * 2);
  while (local_3a <= local_38) {
    local_38 = local_38 - local_3a;
    local_2c = local_2c + 1;
    local_3a = *(ushort *)(in_RDX + (ulong)local_2c * 2);
  }
  GetPattern(in_stack_ffffffffffffff64,in_stack_ffffffffffffff58);
  SolveSudoku(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
              in_stack_ffffffffffffff58,(size_t *)0x105758);
  return;
}

Assistant:

void GetGrid(size_t grid_idx, const void *index, const void *table, char *grid) {
    size_t indexed_grid_idx = grid_idx & ~((1ull << 20u) - 1);
    uint32_t current_pattern_idx = *(uint32_t *)(((char *)index) + (grid_idx >> 20u)* 6);
    uint16_t indexed_grid_offset = *(uint16_t *)(((char *)index) + (grid_idx  >> 20u)* 6 + 4);

    size_t to_skip = indexed_grid_offset + (grid_idx  - indexed_grid_idx);
    uint16_t pattern_count = *(((uint16_t *) table) + current_pattern_idx);
    while (to_skip >= pattern_count) {
        to_skip -= pattern_count;
        current_pattern_idx++;
        pattern_count = *(((uint16_t *) table) + current_pattern_idx);
    }
    char pattern[82];
    GetPattern(current_pattern_idx, pattern);
    size_t guesses;
    SolveSudoku(pattern, to_skip + 1, 1, grid, &guesses);
}